

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioSetWatchdog(uint gpio,uint timeout)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_ESI;
  uint in_EDI;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: gpio=%d timeout=%d\n",pcVar2,"gpioSetWatchdog",(ulong)in_EDI,
            (ulong)in_ESI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar2,"gpioSetWatchdog"
             );
    }
    local_4 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    if (in_ESI < 0xea61) {
      gpioAlert[in_EDI].wdTick = systReg[1];
      gpioAlert[in_EDI].wdSteadyUs = in_ESI * 1000;
      if (in_ESI == 0) {
        wdogBits = wdogBits & (1 << ((byte)in_EDI & 0x1f) ^ 0xffffffffU);
      }
      else {
        wdogBits = wdogBits | 1 << ((byte)in_EDI & 0x1f);
      }
      local_4 = 0;
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: gpio %d, bad timeout (%d)\n",pcVar2,"gpioSetWatchdog",(ulong)in_EDI,
                (ulong)in_ESI);
      }
      local_4 = -0xf;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: bad gpio (%d)\n",pcVar2,"gpioSetWatchdog",(ulong)in_EDI);
    }
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int gpioSetWatchdog(unsigned gpio, unsigned timeout)
{
   DBG(DBG_USER, "gpio=%d timeout=%d", gpio, timeout);

   CHECK_INITED;

   if (gpio > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", gpio);

   if (timeout > PI_MAX_WDOG_TIMEOUT)
      SOFT_ERROR(PI_BAD_WDOG_TIMEOUT,
         "gpio %d, bad timeout (%d)", gpio, timeout);

   gpioAlert[gpio].wdTick   = systReg[SYST_CLO];
   gpioAlert[gpio].wdSteadyUs = timeout*1000;

   if (timeout) wdogBits |= (1<<gpio);
   else         wdogBits &= (~(1<<gpio));

   return 0;
}